

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O3

RGBA deqp::gles3::Functional::FboTestUtil::getFormatThreshold(TextureFormat *format)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar6;
  float fVar7;
  IVec4 bits;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  int iVar5;
  
  tcu::getTextureFormatMantissaBitDepth((tcu *)&local_28,format);
  if ((int)local_28 < 1) {
    uVar2 = 1;
  }
  else {
    uVar2 = 8;
    if (local_28 < 8) {
      uVar2 = local_28;
    }
    fVar7 = ceilf(510.0 / (float)~(-1 << ((byte)uVar2 & 0x1f)));
    uVar4 = 0xff;
    if ((int)fVar7 < 0xff) {
      uVar4 = (int)fVar7;
    }
    uVar2 = 0;
    if (0 < (int)uVar4) {
      uVar2 = uVar4;
    }
  }
  if ((int)local_24 < 1) {
    uVar4 = 0x100;
  }
  else {
    uVar4 = 8;
    if (local_24 < 8) {
      uVar4 = local_24;
    }
    fVar7 = ceilf(510.0 / (float)~(-1 << ((byte)uVar4 & 0x1f)));
    iVar3 = 0xff;
    if ((int)fVar7 < 0xff) {
      iVar3 = (int)fVar7;
    }
    iVar5 = 0;
    if (0 < iVar3) {
      iVar5 = iVar3;
    }
    uVar4 = iVar5 << 8;
  }
  if ((int)local_20 < 1) {
    uVar6 = 0x10000;
  }
  else {
    uVar6 = 8;
    if (local_20 < 8) {
      uVar6 = local_20;
    }
    fVar7 = ceilf(510.0 / (float)~(-1 << ((byte)uVar6 & 0x1f)));
    iVar3 = 0xff;
    if ((int)fVar7 < 0xff) {
      iVar3 = (int)fVar7;
    }
    iVar5 = 0;
    if (0 < iVar3) {
      iVar5 = iVar3;
    }
    uVar6 = iVar5 << 0x10;
  }
  if ((int)local_1c < 1) {
    uVar1 = 0x1000000;
  }
  else {
    uVar1 = 8;
    if (local_1c < 8) {
      uVar1 = local_1c;
    }
    fVar7 = ceilf(510.0 / (float)~(-1 << ((byte)uVar1 & 0x1f)));
    iVar3 = 0xff;
    if ((int)fVar7 < 0xff) {
      iVar3 = (int)fVar7;
    }
    iVar5 = 0;
    if (0 < iVar3) {
      iVar5 = iVar3;
    }
    uVar1 = iVar5 << 0x18;
  }
  return (RGBA)(uVar4 | uVar2 | uVar6 | uVar1);
}

Assistant:

tcu::RGBA getFormatThreshold (const tcu::TextureFormat& format)
{
	const tcu::IVec4 bits = tcu::getTextureFormatMantissaBitDepth(format);

	return tcu::RGBA(calculateU8ConversionError(bits.x()),
					 calculateU8ConversionError(bits.y()),
					 calculateU8ConversionError(bits.z()),
					 calculateU8ConversionError(bits.w()));
}